

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_alternate.h
# Opt level: O2

void __thiscall PlayerAlternate::~PlayerAlternate(PlayerAlternate *this)

{
  Player::~Player(&this->super_Player);
  operator_delete(this);
  return;
}

Assistant:

PlayerAlternate(const std::string& name) :
      Player(name),
      m_first(rand()%3),
      m_second(beats(m_first))
   {}